

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O0

LogicalType * __thiscall duckdb::LogicalGet::GetColumnType(LogicalGet *this,ColumnIndex *index)

{
  bool bVar1;
  undefined8 uVar2;
  pointer pvVar3;
  size_type __n;
  ColumnIndex *in_RSI;
  long in_RDI;
  const_iterator entry;
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  *in_stack_ffffffffffffff68;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff70;
  unsigned_long in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  InternalException *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false> local_30;
  idx_t local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false> local_20;
  ColumnIndex *local_18;
  const_reference local_8;
  
  local_18 = in_RSI;
  bVar1 = ColumnIndex::IsVirtualColumn(in_RSI);
  if (bVar1) {
    local_28 = ColumnIndex::GetPrimaryIndex(local_18);
    local_20._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
         ::find(in_stack_ffffffffffffff68,(key_type *)0xe5e02b);
    local_30._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = ::std::__detail::operator==(&local_20,&local_30);
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffb0,"Failed to find referenced virtual column %d",
                 (allocator *)&stack0xffffffffffffffaf);
      ColumnIndex::GetPrimaryIndex(local_18);
      InternalException::InternalException<unsigned_long>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
    }
    pvVar3 = ::std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>
                           *)0xe5e136);
    local_8 = &(pvVar3->second).type;
  }
  else {
    __n = in_RDI + 0x230;
    ColumnIndex::GetPrimaryIndex(local_18);
    local_8 = vector<duckdb::LogicalType,_true>::operator[](in_stack_ffffffffffffff70,__n);
  }
  return local_8;
}

Assistant:

const LogicalType &LogicalGet::GetColumnType(const ColumnIndex &index) const {
	if (index.IsVirtualColumn()) {
		auto entry = virtual_columns.find(index.GetPrimaryIndex());
		if (entry == virtual_columns.end()) {
			throw InternalException("Failed to find referenced virtual column %d", index.GetPrimaryIndex());
		}
		return entry->second.type;
	}
	return returned_types[index.GetPrimaryIndex()];
}